

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Column *this;
  ulong uVar5;
  size_type sVar6;
  long *in_RDI;
  string description;
  Colour colourGuard;
  Code colour;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  undefined4 in_stack_fffffffffffffcd8;
  Code in_stack_fffffffffffffcdc;
  pluralise *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  Column *in_stack_fffffffffffffcf0;
  IConfig *in_stack_fffffffffffffd28;
  allocator *paVar7;
  TestSpec *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  TestCaseInfo *in_stack_fffffffffffffd48;
  Column *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  allocator local_229;
  string local_228 [79];
  allocator local_1d9;
  string local_1d8 [72];
  string local_190 [32];
  Column local_170;
  Column local_140;
  string local_110 [32];
  string local_f0 [32];
  Column local_d0;
  Column local_a0;
  undefined4 local_6c;
  reference local_68;
  TestCase *local_60;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_58;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_50;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_48 [2];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x60))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffce0,
                     (TestSpec *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  bVar1 = (**(code **)(*local_8 + 0x68))();
  if ((bVar1 & 1) == 0) {
    poVar4 = cout();
    std::operator<<(poVar4,"All available test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<(poVar4,"Matching test cases:\n");
  }
  getAllTestCasesSorted((IConfig *)0x120c2b);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
              in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_50 = local_48;
  local_58._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_60 = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)), bVar2
        ) {
    local_68 = __gnu_cxx::
               __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_58);
    bVar2 = TestCaseInfo::isHidden(&local_68->super_TestCaseInfo);
    local_6c = 0;
    if (bVar2) {
      local_6c = 0x17;
    }
    Colour::Colour((Colour *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
    cout();
    clara::TextFlow::Column::Column(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    this = clara::TextFlow::Column::initialIndent(&local_a0,2);
    clara::TextFlow::Column::indent(this,4);
    poVar4 = clara::TextFlow::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::operator<<(poVar4,"\n");
    clara::TextFlow::Column::~Column((Column *)0x120db0);
    iVar3 = (**(code **)(*local_8 + 0xa0))();
    if (1 < iVar3) {
      in_stack_fffffffffffffd80 = cout();
      Detail::stringify<Catch::SourceLineInfo>
                ((SourceLineInfo *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      clara::TextFlow::Column::Column(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      in_stack_fffffffffffffd78 = clara::TextFlow::Column::indent(&local_d0,4);
      poVar4 = clara::TextFlow::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column((Column *)0x120e7f);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::string(local_110,(string *)&(local_68->super_TestCaseInfo).description);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        std::__cxx11::string::operator=(local_110,"(NO DESCRIPTION)");
      }
      cout();
      clara::TextFlow::Column::Column(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      clara::TextFlow::Column::indent(&local_140,4);
      poVar4 = clara::TextFlow::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column((Column *)0x121016);
      std::__cxx11::string::~string(local_110);
    }
    bVar2 = clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&in_stack_fffffffffffffcf0->m_strings);
    if (!bVar2) {
      cout();
      TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_fffffffffffffd48);
      clara::TextFlow::Column::Column(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      in_stack_fffffffffffffd48 = (TestCaseInfo *)clara::TextFlow::Column::indent(&local_170,6);
      poVar4 = clara::TextFlow::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::operator<<(poVar4,"\n");
      clara::TextFlow::Column::~Column((Column *)0x1210fa);
      std::__cxx11::string::~string(local_190);
    }
    Colour::~Colour((Colour *)0x12115c);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_58);
  }
  bVar1 = (**(code **)(*local_8 + 0x68))();
  if ((bVar1 & 1) == 0) {
    cout();
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_48);
    paVar7 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"test case",paVar7);
    pluralise::pluralise
              (in_stack_fffffffffffffce0,
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),(string *)0x12120a);
    poVar4 = operator<<((ostream *)in_stack_fffffffffffffce0,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x12125b);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  else {
    cout();
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"matching test case",&local_229);
    pluralise::pluralise
              (in_stack_fffffffffffffce0,
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),(string *)0x12134b);
    in_stack_fffffffffffffcf0 =
         (Column *)
         operator<<((ostream *)in_stack_fffffffffffffce0,
                    (pluralise *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffcf0,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x12139c);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  sVar6 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(local_48);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffcf0)
  ;
  TestSpec::~TestSpec((TestSpec *)0x12144d);
  return sVar6;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
        }

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Column( testCaseInfo.name ).initialIndent( 2 ).indent( 4 ) << "\n";
            if( config.verbosity() >= Verbosity::High ) {
                Catch::cout() << Column( Catch::Detail::stringify( testCaseInfo.lineInfo ) ).indent(4) << std::endl;
                std::string description = testCaseInfo.description;
                if( description.empty() )
                    description = "(NO DESCRIPTION)";
                Catch::cout() << Column( description ).indent(4) << std::endl;
            }
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Column( testCaseInfo.tagsAsString() ).indent( 6 ) << "\n";
        }

        if( !config.hasTestFilters() )
            Catch::cout() << pluralise( matchedTestCases.size(), "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTestCases.size(), "matching test case" ) << '\n' << std::endl;
        return matchedTestCases.size();
    }